

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var __thiscall
Js::InterpreterStackFrame::OP_InitBaseClass
          (InterpreterStackFrame *this,FrameDisplay *environment,FunctionInfoPtrPtr infoRef,
          RegSlot protoReg)

{
  DynamicObject *protoParent;
  Var pvVar1;
  
  protoParent = JavascriptLibraryBase::GetObjectPrototype
                          (*(JavascriptLibraryBase **)(*(long *)(this + 0x78) + 8));
  pvVar1 = InitClassHelper(this,environment,infoRef,&protoParent->super_RecyclableObject,
                           *(RecyclableObject **)(*(long *)(*(long *)(this + 0x78) + 8) + 0x290),
                           protoReg);
  return pvVar1;
}

Assistant:

Var InterpreterStackFrame::OP_InitBaseClass(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, RegSlot protoReg)
    {
        RecyclableObject * protoParent = scriptContext->GetLibrary()->GetObjectPrototype();
        RecyclableObject * constructorParent = scriptContext->GetLibrary()->GetFunctionPrototype();

        return InitClassHelper(environment, infoRef, protoParent, constructorParent, protoReg);
    }